

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O0

bool __thiscall cmFileCopier::SetPermissions(cmFileCopier *this,string *toFile,mode_t permissions)

{
  cmCommand *this_00;
  bool bVar1;
  ostream *poVar2;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream e;
  mode_t permissions_local;
  string *toFile_local;
  cmFileCopier *this_local;
  
  if ((permissions == 0) ||
     (bVar1 = cmsys::SystemTools::SetPermissions(toFile,permissions,false), bVar1)) {
    this_local._7_1_ = true;
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar2 = std::operator<<((ostream *)local_1a0,this->Name);
    poVar2 = std::operator<<(poVar2," cannot set permissions on \"");
    poVar2 = std::operator<<(poVar2,(string *)toFile);
    std::operator<<(poVar2,"\"");
    this_00 = &this->FileCommand->super_cmCommand;
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(this_00,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    this_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  return this_local._7_1_;
}

Assistant:

bool cmFileCopier::SetPermissions(const std::string& toFile,
                                  mode_t permissions)
{
  if (permissions) {
#ifdef WIN32
    if (Makefile->IsOn("CMAKE_CROSSCOMPILING")) {
      // Store the mode in an NTFS alternate stream.
      std::string mode_t_adt_filename = toFile + ":cmake_mode_t";

      // Writing to an NTFS alternate stream changes the modification
      // time, so we need to save and restore its original value.
      cmSystemToolsFileTime* file_time_orig = cmSystemTools::FileTimeNew();
      cmSystemTools::FileTimeGet(toFile, file_time_orig);

      cmsys::ofstream permissionStream(mode_t_adt_filename.c_str());

      if (permissionStream) {
        permissionStream << std::oct << permissions << std::endl;
      }

      permissionStream.close();

      cmSystemTools::FileTimeSet(toFile, file_time_orig);

      cmSystemTools::FileTimeDelete(file_time_orig);
    }
#endif

    if (!cmSystemTools::SetPermissions(toFile, permissions)) {
      std::ostringstream e;
      e << this->Name << " cannot set permissions on \"" << toFile << "\"";
      this->FileCommand->SetError(e.str());
      return false;
    }
  }
  return true;
}